

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyncAwait.h
# Opt level: O0

pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* async_simple::coro::
  syncAwait<async_simple::coro::Lazy<std::pair<std::error_code,std::__cxx11::string>>>
            (Lazy<std::pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *lazy)

{
  pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  Try<std::pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  value;
  Condition cond;
  Executor *executor;
  pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff58;
  Condition *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  type_conflict5 *callback;
  undefined8 in_stack_ffffffffffffff70;
  undefined1 x;
  Try<std::pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  Try<std::pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  type_conflict5 local_1c;
  
  x = (undefined1)((ulong)in_stack_ffffffffffffff70 >> 0x38);
  local_1c._4_8_ =
       detail::
       LazyBase<std::pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
       ::getExecutor((LazyBase<std::pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                      *)0x66e741);
  if ((Executor *)local_1c._4_8_ != (Executor *)0x0) {
    (*((Executor *)local_1c._4_8_)->_vptr_Executor[3])();
    logicAssert((bool)x,in_stack_ffffffffffffff68);
  }
  callback = &local_1c;
  util::Condition::Condition(in_stack_ffffffffffffff60,(ptrdiff_t)in_stack_ffffffffffffff58);
  this_00 = &local_58;
  Try<std::pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Try((Try<std::pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x66e79b);
  detail::
  LazyBase<std::pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ::
  start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_include_async_simple_coro_SyncAwait_h:44:16)>
            ((LazyBase<std::pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
              *)this_00,callback);
  std::counting_semaphore<1L>::acquire((counting_semaphore<1L> *)in_stack_ffffffffffffff58);
  this = Try<std::pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::value(this_00);
  std::
  pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair(this,in_stack_ffffffffffffff58);
  Try<std::pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~Try((Try<std::pair<std::error_code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x66e7fa);
  return in_RDI;
}

Assistant:

inline auto syncAwait(LazyType &&lazy) {
    auto executor = lazy.getExecutor();
    if (executor)
        logicAssert(!executor->currentThreadInExecutor(),
                    "do not sync await in the same executor with Lazy");

    util::Condition cond;
    using ValueType = typename std::decay_t<LazyType>::ValueType;

    Try<ValueType> value;
    std::move(std::forward<LazyType>(lazy))
        .start([&cond, &value](Try<ValueType> result) {
            value = std::move(result);
            cond.release();
        });
    cond.acquire();
    return std::move(value).value();
}